

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O3

void __thiscall
ON_BumpFunction::Evaluate(ON_BumpFunction *this,double s,double t,int der_count,double *value)

{
  double *value_00;
  double dt;
  double dt_00;
  double *value_01;
  long lVar1;
  ulong uVar2;
  long lVar3;
  ON_BumpFunction *this_00;
  long lVar4;
  double dVar5;
  double dVar6;
  double tmp [20];
  double local_d8 [21];
  
  if (der_count < 10) {
    value_01 = local_d8;
    this_00 = this;
  }
  else {
    this_00 = (ON_BumpFunction *)((ulong)(der_count * 2 + 2) << 3);
    value_01 = (double *)onmalloc((size_t)this_00);
  }
  value_00 = value_01 + (int)(der_count + 1U);
  dVar5 = s - this->m_x0;
  dt = this->m_sx[0.0 <= dVar5];
  dVar5 = dVar5 * dt;
  dVar6 = t - this->m_y0;
  dt_00 = this->m_sy[0.0 <= dVar6];
  dVar6 = dVar6 * dt_00;
  if (this->m_type[0] == 5) {
    Internal_EvaluateQuinticBump(this_00,dVar5,dt,der_count,value_01);
LAB_0055e78f:
    if (this->m_type[1] == 5) goto LAB_0055e796;
    *value_00 = dVar6;
    if (0 < der_count) {
      value_00[1] = dt_00;
      if (der_count != 1) {
        memset(value_00 + 2,0,(ulong)(der_count - 1) << 3);
      }
      goto LAB_0055e7e0;
    }
  }
  else {
    *value_01 = dVar5;
    if (der_count < 1) goto LAB_0055e78f;
    value_01[1] = dt;
    if (der_count != 1) {
      this_00 = (ON_BumpFunction *)(value_01 + 2);
      memset(this_00,0,(ulong)(der_count - 1) << 3);
      goto LAB_0055e78f;
    }
    if (this->m_type[1] != 5) {
      *value_00 = dVar6;
      value_00[1] = dt_00;
      goto LAB_0055e7e0;
    }
LAB_0055e796:
    Internal_EvaluateQuinticBump(this_00,dVar6,dt_00,der_count,value_00);
  }
  if (der_count < 0) {
    return;
  }
LAB_0055e7e0:
  lVar1 = 1;
  uVar2 = 0;
  do {
    lVar3 = 0;
    lVar4 = 0;
    do {
      value[lVar4] = this->m_a * *(double *)((long)value_01 + lVar3) * value_00[lVar4];
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + -8;
    } while (lVar1 != lVar4);
    uVar2 = uVar2 + 1;
    lVar1 = lVar1 + 1;
    value_01 = value_01 + 1;
    value = (double *)((long)value - lVar3);
  } while (uVar2 != der_count + 1U);
  return;
}

Assistant:

void ON_BumpFunction::Evaluate(double s, double t, int der_count, double* value) const
{
  double tmp[20];
  double* xvalue;
  double* yvalue;
  xvalue = ( der_count > 9 ) 
         ? ((double*)onmalloc((der_count+1)*2*sizeof(xvalue[0])))
         : &tmp[0];
  yvalue = xvalue + (der_count+1);
  double x = s-m_x0;
  const double dx = m_sx[x >= 0.0 ? 1 : 0];
  x *= dx;
  double y = t-m_y0;
  const double dy = m_sy[y >= 0.0 ? 1 : 0];
  y *= dy;

  if ( 5 == m_type[0] )
  {
    Internal_EvaluateQuinticBump(x,dx,der_count,xvalue);
  }
  else
  {
    Internal_EvaluateLinearBump(x,dx,der_count,xvalue);
  }
  if ( 5 == m_type[1] )
  {
    Internal_EvaluateQuinticBump(y,dy,der_count,yvalue);
  }
  else
  {
    Internal_EvaluateLinearBump(y,dy,der_count,yvalue);
  }

  int n, i, j;
  for ( n = 0; n <= der_count; n++ )
  {
    for ( i = n, j = 0; j <= n; i--, j++ )
    {
      *value++ = m_a*xvalue[i]*yvalue[j]; // d^nf/(ds^i dt^j)
    }
  }
}